

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::piece_picker::get_downloaders
          (piece_picker *this,
          vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *d,
          piece_index_t index)

{
  pointer *ppptVar1;
  ushort uVar2;
  pointer pptVar3;
  pointer ppVar4;
  iterator __position;
  iterator iVar5;
  download_queue_t queue;
  uint uVar6;
  ulong __n;
  pointer __args;
  torrent_peer *local_30;
  
  pptVar3 = (d->
            super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((d->
      super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != pptVar3) {
    (d->super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pptVar3;
  }
  ppVar4 = (this->m_piece_map).
           super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)(ppVar4 + index.m_val);
  queue.m_val = (byte)(uVar6 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar6 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  uVar2 = (&this->m_blocks_per_piece)
          [index.m_val + 1 ==
           (int)((ulong)((long)(this->m_piece_map).
                               super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                               .
                               super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) >> 3)];
  __n = (ulong)uVar2;
  std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::reserve
            (d,__n);
  if (queue.m_val == '\x04') {
    if (uVar2 != 0) {
      do {
        local_30 = (torrent_peer *)0x0;
        std::vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>>::
        emplace_back<libtorrent::torrent_peer*>
                  ((vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>> *)d,
                   &local_30);
        uVar6 = (int)__n - 1;
        __n = (ulong)uVar6;
      } while (uVar6 != 0);
    }
  }
  else {
    iVar5 = find_dl_piece(this,queue,index);
    if (uVar2 != 0) {
      __args = (this->m_block_info).
               super_vector<libtorrent::piece_picker::block_info,_std::allocator<libtorrent::piece_picker::block_info>_>
               .
               super__Vector_base<libtorrent::piece_picker::block_info,_std::allocator<libtorrent::piece_picker::block_info>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (ulong)this->m_blocks_per_piece * (ulong)(iVar5._M_current)->info_idx;
      do {
        __position._M_current =
             (d->
             super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (d->
            super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>>::
          _M_realloc_insert<libtorrent::torrent_peer*const&>
                    ((vector<libtorrent::torrent_peer*,std::allocator<libtorrent::torrent_peer*>> *)
                     d,__position,&__args->peer);
        }
        else {
          *__position._M_current = __args->peer;
          ppptVar1 = &(d->
                      super__Vector_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar1 = *ppptVar1 + 1;
        }
        __args = __args + 1;
        __n = __n - 1;
      } while (__n != 0);
    }
  }
  return;
}

Assistant:

void piece_picker::get_downloaders(std::vector<torrent_peer*>& d
		, piece_index_t const index) const
	{
		d.clear();
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			for (int i = 0; i < num_blocks; ++i) d.push_back(nullptr);
			return;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
	}